

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O0

bool cmUtilitySourceCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  reference pbVar4;
  cmMakefile *pcVar5;
  string *psVar6;
  char *pcVar7;
  reference __rhs;
  reference __rhs_00;
  ulong uVar8;
  bool local_402;
  bool local_401;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  cmValue local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [8];
  string utilityExecutable;
  allocator<char> local_271;
  string local_270;
  cmValue local_250;
  cmValue d;
  string exePath;
  string utilityDirectory;
  string local_200;
  string *local_1e0;
  string *cmakeCFGout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string utilitySource;
  string *relativeSource;
  reference local_108;
  string *utilityName;
  cmState *state;
  string msg;
  allocator<char> local_c9;
  string local_c8;
  bool local_a2;
  allocator<char> local_a1;
  undefined1 local_a0 [6];
  bool haveCacheValue;
  string *local_80;
  string *intDir;
  cmValue cacheValue;
  string *cacheEntry;
  const_iterator arg;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar3 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00693b12;
  }
  cacheEntry = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
  cacheValue.Value =
       (string *)
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&cacheEntry,0);
  pbVar4 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&cacheValue);
  pcVar5 = cmExecutionStatus::GetMakefile(local_20);
  intDir = (string *)cmMakefile::GetDefinition(pcVar5,pbVar4);
  pcVar5 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"CMAKE_CFG_INTDIR",&local_a1);
  psVar6 = cmMakefile::GetRequiredDefinition(pcVar5,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_a2 = false;
  local_80 = psVar6;
  pcVar5 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_CROSSCOMPILING",&local_c9);
  bVar1 = cmMakefile::IsOn(pcVar5,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  if (bVar1) {
    msg.field_2._8_8_ = intDir;
    local_a2 = operator!=((cmValue)intDir,(nullptr_t)0x0);
    if (!local_a2) {
      cmStrCat<char_const(&)[52],std::__cxx11::string_const&,char_const(&)[160]>
                ((string *)&state,
                 (char (*) [52])"UTILITY_SOURCE is used in cross compiling mode for ",pbVar4,
                 (char (*) [160])
                 ". If your intention is to run this executable, you need to preload the cache with the full path to a version of that program, which runs on this build machine."
                );
      cmSystemTools::Message((string *)&state,"Warning");
      std::__cxx11::string::~string((string *)&state);
    }
  }
  else {
    pcVar5 = cmExecutionStatus::GetMakefile(local_20);
    utilityName = (string *)cmMakefile::GetState(pcVar5);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&intDir);
    local_401 = false;
    if (bVar1) {
      cmValue::operator->[abi_cxx11_((cmValue *)&intDir);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      pcVar7 = strstr(pcVar7,"(IntDir)");
      if (pcVar7 != (char *)0x0) {
        bVar1 = std::operator==(local_80,"$(IntDir)");
        local_401 = false;
        if (!bVar1) goto LAB_006931d6;
      }
      uVar2 = cmState::GetCacheMajorVersion((cmState *)utilityName);
      local_402 = false;
      if (uVar2 != 0) {
        uVar2 = cmState::GetCacheMinorVersion((cmState *)utilityName);
        local_402 = uVar2 != 0;
      }
      local_401 = local_402;
    }
LAB_006931d6:
    local_a2 = local_401;
  }
  if ((local_a2 & 1U) == 0) {
    relativeSource =
         (string *)
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&cacheEntry,0);
    local_108 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&relativeSource);
    utilitySource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&cacheEntry,0);
    __rhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&utilitySource.field_2 + 8));
    pcVar5 = cmExecutionStatus::GetMakefile(local_20);
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar5);
    std::__cxx11::string::string((string *)local_140,(string *)psVar6);
    std::operator+(&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "/");
    std::operator+(&local_160,&local_180,__rhs);
    std::__cxx11::string::operator=((string *)local_140,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_140);
    if (bVar1) {
      do {
        file.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cacheEntry,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&file.field_2 + 8));
        if (!bVar1) {
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,"CMAKE_CFG_INTDIR",
                     (allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xf));
          psVar6 = cmMakefile::GetRequiredDefinition(pcVar5,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xf));
          local_1e0 = psVar6;
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
          std::__cxx11::string::string
                    ((string *)(exePath.field_2._M_local_buf + 8),(string *)psVar6);
          std::__cxx11::string::string((string *)&d);
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"EXECUTABLE_OUTPUT_PATH",&local_271);
          local_250 = cmMakefile::GetDefinition(pcVar5,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          bVar1 = cmValue::operator_cast_to_bool(&local_250);
          if (bVar1) {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_250);
            std::__cxx11::string::operator=((string *)&d,(string *)psVar6);
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator=
                      ((string *)(exePath.field_2._M_local_buf + 8),(string *)&d);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utilityExecutable.field_2 + 8),"/",__rhs);
            std::__cxx11::string::operator+=
                      ((string *)(exePath.field_2._M_local_buf + 8),
                       (string *)(utilityExecutable.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(utilityExecutable.field_2._M_local_buf + 8));
          }
          std::operator+(&local_338,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&exePath.field_2 + 8),"/");
          std::operator+(&local_318,&local_338,local_1e0);
          std::operator+(&local_2f8,&local_318,"/");
          std::operator+(&local_2d8,&local_2f8,local_108);
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_360,"CMAKE_EXECUTABLE_SUFFIX",&local_361);
          local_340 = cmMakefile::GetDefinition(pcVar5,&local_360);
          psVar6 = cmValue::operator*[abi_cxx11_(&local_340);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8,&local_2d8,psVar6);
          std::__cxx11::string::~string((string *)&local_360);
          std::allocator<char>::~allocator(&local_361);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_338);
          cmsys::SystemTools::ReplaceString((string *)local_2b8,"/./","/");
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_388,"Path to an internal program.",&local_389);
          cmMakefile::AddCacheDefinition
                    (pcVar5,pbVar4,(string *)local_2b8,&local_388,FILEPATH,false);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator(&local_389);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_2b8);
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          pbVar4 = local_108;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b0,"Executable to project name.",&local_3b1);
          cmMakefile::AddCacheDefinition
                    (pcVar5,(string *)local_2b8,pbVar4,&local_3b0,INTERNAL,false);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::allocator<char>::~allocator(&local_3b1);
          args_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_2b8);
          std::__cxx11::string::~string((string *)&d);
          std::__cxx11::string::~string((string *)(exePath.field_2._M_local_buf + 8));
          break;
        }
        std::operator+(&local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"/");
        cmakeCFGout = (string *)
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&cacheEntry,0);
        __rhs_00 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&cmakeCFGout);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,&local_1d0,__rhs_00);
        std::__cxx11::string::~string((string *)&local_1d0);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_1b0);
        if (!bVar1) {
          args_local._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_1b0);
      } while (bVar1);
    }
    else {
      args_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_140);
  }
  else {
    args_local._7_1_ = 1;
  }
LAB_00693b12:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmUtilitySourceCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  cmValue cacheValue = status.GetMakefile().GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  std::string const& intDir =
    status.GetMakefile().GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (status.GetMakefile().IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != nullptr);
    if (!haveCacheValue) {
      std::string msg = cmStrCat(
        "UTILITY_SOURCE is used in cross compiling mode for ", cacheEntry,
        ". If your intention is to run this executable, you need to "
        "preload the cache with the full path to a version of that "
        "program, which runs on this build machine.");
      cmSystemTools::Message(msg, "Warning");
    }
  } else {
    cmState* state = status.GetMakefile().GetState();
    haveCacheValue = (cacheValue &&
                      (strstr(cacheValue->c_str(), "(IntDir)") == nullptr ||
                       (intDir == "$(IntDir)")) &&
                      (state->GetCacheMajorVersion() != 0 &&
                       state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = status.GetMakefile().GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource)) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file)) {
      return true;
    }
  }

  // The source exists.
  const std::string& cmakeCFGout =
    status.GetMakefile().GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory =
    status.GetMakefile().GetCurrentBinaryDirectory();
  std::string exePath;
  if (cmValue d =
        status.GetMakefile().GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = *d;
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName +
    *status.GetMakefile().GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  status.GetMakefile().AddCacheDefinition(cacheEntry, utilityExecutable,
                                          "Path to an internal program.",
                                          cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  status.GetMakefile().AddCacheDefinition(utilityExecutable, utilityName,
                                          "Executable to project name.",
                                          cmStateEnums::INTERNAL);

  return true;
}